

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_gcc.cc
# Opt level: O1

void ARGBToRAWRow_AVX2(uint8_t *src,uint8_t *dst,int width)

{
  undefined1 (*pauVar1) [32];
  undefined1 (*pauVar2) [32];
  undefined1 (*pauVar3) [32];
  undefined1 auVar4 [32];
  bool bVar5;
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  lvec32 aiVar10;
  int iVar11;
  undefined1 auVar12 [32];
  
  aiVar10 = libyuv::kPermdRGB24_AVX;
  auVar12._16_16_ = (undefined1  [16])libyuv::kShuffleMaskARGBToRAW;
  auVar12._0_16_ = (undefined1  [16])libyuv::kShuffleMaskARGBToRAW;
  do {
    auVar4 = *(undefined1 (*) [32])src;
    pauVar1 = (undefined1 (*) [32])((long)src + 0x20);
    pauVar2 = (undefined1 (*) [32])((long)src + 0x40);
    pauVar3 = (undefined1 (*) [32])((long)src + 0x60);
    src = (uint8_t *)((long)src + 0x80);
    auVar4 = vpshufb_avx2(auVar4,auVar12);
    auVar6 = vpshufb_avx2(*pauVar1,auVar12);
    auVar7 = vpshufb_avx2(*pauVar2,auVar12);
    auVar8 = vpshufb_avx2(*pauVar3,auVar12);
    auVar4 = vpermd_avx2((undefined1  [32])aiVar10,auVar4);
    auVar6 = vpermd_avx2((undefined1  [32])aiVar10,auVar6);
    auVar7 = vpermd_avx2((undefined1  [32])aiVar10,auVar7);
    auVar8 = vpermd_avx2((undefined1  [32])aiVar10,auVar8);
    auVar9 = vpermq_avx2(auVar6,0x3f);
    auVar4 = vpor_avx2(auVar4,auVar9);
    *(undefined1 (*) [32])dst = auVar4;
    auVar4 = vpermq_avx2(auVar6,0xf9);
    auVar6 = vpermq_avx2(auVar7,0x4f);
    auVar4 = vpor_avx2(auVar4,auVar6);
    *(undefined1 (*) [32])((long)dst + 0x20) = auVar4;
    auVar4 = vpermq_avx2(auVar7,0xfe);
    auVar6 = vpermq_avx2(auVar8,0x93);
    auVar4 = vpor_avx2(auVar4,auVar6);
    *(undefined1 (*) [32])((long)dst + 0x40) = auVar4;
    dst = (uint8_t *)((long)dst + 0x60);
    iVar11 = width + -0x20;
    bVar5 = 0x1f < width;
    width = iVar11;
  } while (iVar11 != 0 && bVar5);
  return;
}

Assistant:

void ARGBToRAWRow_AVX2(const uint8_t* src, uint8_t* dst, int width) {
  asm volatile(
      "vbroadcastf128 %3,%%ymm6                  \n"
      "vmovdqa     %4,%%ymm7                     \n"

      LABELALIGN
      "1:                                        \n"
      "vmovdqu     (%0),%%ymm0                   \n"
      "vmovdqu     0x20(%0),%%ymm1               \n"
      "vmovdqu     0x40(%0),%%ymm2               \n"
      "vmovdqu     0x60(%0),%%ymm3               \n"
      "lea         0x80(%0),%0                   \n"
      "vpshufb     %%ymm6,%%ymm0,%%ymm0          \n"  // xxx0yyy0
      "vpshufb     %%ymm6,%%ymm1,%%ymm1          \n"
      "vpshufb     %%ymm6,%%ymm2,%%ymm2          \n"
      "vpshufb     %%ymm6,%%ymm3,%%ymm3          \n"
      "vpermd      %%ymm0,%%ymm7,%%ymm0          \n"  // pack to 24 bytes
      "vpermd      %%ymm1,%%ymm7,%%ymm1          \n"
      "vpermd      %%ymm2,%%ymm7,%%ymm2          \n"
      "vpermd      %%ymm3,%%ymm7,%%ymm3          \n"
      "vpermq      $0x3f,%%ymm1,%%ymm4           \n"  // combine 24 + 8
      "vpor        %%ymm4,%%ymm0,%%ymm0          \n"
      "vmovdqu     %%ymm0,(%1)                   \n"
      "vpermq      $0xf9,%%ymm1,%%ymm1           \n"  // combine 16 + 16
      "vpermq      $0x4f,%%ymm2,%%ymm4           \n"
      "vpor        %%ymm4,%%ymm1,%%ymm1          \n"
      "vmovdqu     %%ymm1,0x20(%1)               \n"
      "vpermq      $0xfe,%%ymm2,%%ymm2           \n"  // combine 8 + 24
      "vpermq      $0x93,%%ymm3,%%ymm3           \n"
      "vpor        %%ymm3,%%ymm2,%%ymm2          \n"
      "vmovdqu     %%ymm2,0x40(%1)               \n"
      "lea         0x60(%1),%1                   \n"
      "sub         $0x20,%2                      \n"
      "jg          1b                            \n"
      "vzeroupper                                \n"
      : "+r"(src),                   // %0
        "+r"(dst),                   // %1
        "+r"(width)                  // %2
      : "m"(kShuffleMaskARGBToRAW),  // %3
        "m"(kPermdRGB24_AVX)         // %4
      : "memory", "cc", "xmm0", "xmm1", "xmm2", "xmm3", "xmm4", "xmm5", "xmm6",
        "xmm7");
}